

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_runtimes.cpp
# Opt level: O3

size_t fibonacci(size_t T,size_t N)

{
  U *pUVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Ptr_type _Var4;
  int iVar5;
  Node *o;
  undefined8 *puVar6;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  pthread_mutex_t *__mutex;
  long in_FS_OFFSET;
  promise<void> p;
  size_t res;
  Executor executor;
  promise<void> local_1e0;
  size_t local_1c8;
  promise<void> local_1c0;
  size_t local_1a8;
  size_t *local_1a0;
  future<void> local_198;
  shared_ptr<tf::WorkerInterface> local_188;
  __basic_future<void> local_178;
  Executor local_168;
  
  local_188.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_188.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&local_168,T,&local_188);
  if (local_188.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_188.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&local_168._topology_mutex);
  if (iVar5 == 0) {
    local_168._num_topologies = local_168._num_topologies + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&local_168._topology_mutex);
    std::promise<void>::promise(&local_1e0);
    std::__basic_future<void>::__basic_future(&local_178,&local_1e0._M_future);
    _Var4._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
         local_1e0._M_storage._M_t.
         super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
         .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl;
    _Var3._M_pi = local_1e0._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar2 = local_1e0._M_future.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_1c0._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_1e0._M_future.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1e0._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e0._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )(__uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
            )0x0;
    local_1c0._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var3._M_pi;
    local_1e0._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_1c0._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
         _Var4._M_t.
         super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
         ._M_t.
         super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
         .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl;
    local_1a8 = N;
    local_1a0 = &local_1c8;
    o = (Node *)operator_new(0xd8);
    o->_nstate = 0;
    o->_estate = (__atomic_base<int>)0x40000000;
    (o->_name)._M_dataplus._M_p = (pointer)&(o->_name).field_2;
    (o->_name)._M_string_length = 0;
    (o->_name).field_2._M_local_buf[0] = '\0';
    pUVar1 = &(o->_edges).super_SmallVectorImpl<tf::Node_*>.
              super_SmallVectorTemplateBase<tf::Node_*,_true>.
              super_SmallVectorTemplateCommon<tf::Node_*,_void>.FirstEl;
    o->_data = (void *)0x0;
    o->_topology = (Topology *)0x0;
    o->_parent = (Node *)0x0;
    o->_num_successors = 0;
    (o->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.BeginX = pUVar1;
    (o->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.EndX = pUVar1;
    (o->_edges).super_SmallVectorImpl<tf::Node_*>.super_SmallVectorTemplateBase<tf::Node_*,_true>.
    super_SmallVectorTemplateCommon<tf::Node_*,_void>.super_SmallVectorBase.CapacityX =
         &o->_join_counter;
    (o->_join_counter).super___atomic_base<unsigned_long>._M_i = 0;
    *(undefined8 *)
     &(o->_handle).
      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ._M_u = 0;
    *(undefined8 *)
     ((long)&(o->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 8) = 0;
    *(undefined8 *)
     ((long)&(o->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x10) = 0;
    *(undefined8 *)
     ((long)&(o->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x18) = 0;
    puVar6 = (undefined8 *)operator_new(0x28);
    *puVar6 = peVar2;
    local_1c0._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    puVar6[1] = _Var3._M_pi;
    local_1c0._M_future.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    ((__uniq_ptr_data<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter,_true,_true>
      *)(puVar6 + 2))->
    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
         = (__uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
            )_Var4._M_t.
             super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
             .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl;
    local_1c0._M_storage._M_t.
    super___uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
    ._M_t.
    super__Tuple_impl<0UL,_std::__future_base::_Result<void>_*,_std::__future_base::_Result_base::_Deleter>
    .super__Head_base<0UL,_std::__future_base::_Result<void>_*,_false>._M_head_impl =
         (__uniq_ptr_data<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter,_true,_true>
          )(__uniq_ptr_impl<std::__future_base::_Result<void>,_std::__future_base::_Result_base::_Deleter>
            )0x0;
    puVar6[3] = N;
    puVar6[4] = &local_1c8;
    *(undefined8 **)
     &(o->_handle).
      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      .
      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
      ._M_u = puVar6;
    *(code **)((long)&(o->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x18) =
         std::
         _Function_handler<void_(tf::Runtime_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/async.hpp:67:7)>
         ::_M_invoke;
    *(code **)((long)&(o->_handle).
                      super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
                      .
                      super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
              + 0x10) =
         std::
         _Function_handler<void_(tf::Runtime_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/async.hpp:67:7)>
         ::_M_manager;
    *(undefined1 *)
     ((long)&(o->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x20) = 2;
    *(__index_type *)
     ((long)&(o->_handle).
             super__Variant_base<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_assign_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Move_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Copy_ctor_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
             .
             super__Variant_storage_alias<std::monostate,_tf::Node::Static,_tf::Node::Runtime,_tf::Node::Subflow,_tf::Node::Condition,_tf::Node::MultiCondition,_tf::Node::Module,_tf::Node::Async,_tf::Node::DependentAsync>
     + 0x38) = '\a';
    (o->_semaphores)._M_t.
    super___uniq_ptr_impl<tf::Node::Semaphores,_std::default_delete<tf::Node::Semaphores>_>._M_t.
    super__Tuple_impl<0UL,_tf::Node::Semaphores_*,_std::default_delete<tf::Node::Semaphores>_>.
    super__Head_base<0UL,_tf::Node::Semaphores_*,_false>._M_head_impl = (Semaphores *)0x0;
    (o->_exception_ptr)._M_exception_object = (void *)0x0;
    if (*(Worker **)(in_FS_OFFSET + -8) == (Worker *)0x0) {
      uVar7 = (ulong)o %
              (ulong)(((long)local_168._buffers._buckets.
                             super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_168._buffers._buckets.
                             super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 7) * -0x5555555555555555);
      __mutex = (pthread_mutex_t *)
                (local_168._buffers._buckets.
                 super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7);
      iVar5 = pthread_mutex_lock(__mutex);
      if (iVar5 != 0) {
        std::__throw_system_error(iVar5);
      }
      tf::UnboundedTaskQueue<tf::Node_*>::push
                (&local_168._buffers._buckets.
                  super__Vector_base<tf::Freelist<tf::Node_*>::Bucket,_std::allocator<tf::Freelist<tf::Node_*>::Bucket>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar7].queue,o);
      pthread_mutex_unlock(__mutex);
      tf::NonblockingNotifierV2::_notify<false>(&local_168._notifier);
    }
    else {
      tf::Executor::_schedule(&local_168,*(Worker **)(in_FS_OFFSET + -8),o);
    }
    std::promise<void>::~promise(&local_1c0);
    local_198.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_178._M_state.
         super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_198.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_178._M_state.
            super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    std::promise<void>::~promise(&local_1e0);
    std::future<void>::get(&local_198);
    if (local_198.super___basic_future<void>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.super___basic_future<void>._M_state.
                 super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    tf::Executor::~Executor(&local_168);
    return local_1c8;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

size_t fibonacci(size_t T, size_t N) {
  tf::Executor executor(T);
  size_t res;
  executor.async([N, &res](tf::Runtime& rt){ res = fibonacci(N, rt); }).get();
  return res;
}